

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O2

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra>::EvaluateErrorT<std::complex<double>>
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra> *this,TPZVec<double> *errors,
          bool store_errors)

{
  int64_t row;
  TPZVec<double> *pTVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  long *plVar6;
  TPZIntPoints *obj;
  TPZGeoEl *pTVar7;
  TPZCompMesh *pTVar8;
  TPZFMatrix<double> *this_00;
  double *pdVar9;
  undefined7 in_register_00000011;
  ulong uVar10;
  int ier_1;
  char *pcVar11;
  int ier_2;
  uint uVar12;
  uint i;
  ulong uVar13;
  ulong uVar14;
  double dVar15;
  int maxIntOrder;
  TPZAutoPointer<TPZIntPoints> intrule;
  REAL weight;
  undefined4 uStack_35f64;
  long lStack_35f60;
  TPZVec<double> *pTStack_35f58;
  long *plStack_35f50;
  REAL detJac;
  TPZManVector<int,_3> prevorder;
  TPZManVector<int,_3> maxorder;
  TPZManVector<double,_10> values;
  TPZManVector<double,_10> intpoint;
  TPZManVector<double,_10> u_exact;
  TPZFNMatrix<9,_double> jacInv;
  TPZFNMatrix<9,_double> axe;
  TPZFNMatrix<9,_double> jac;
  TPZFNMatrix<3,_double> du_exact;
  TPZManVector<TPZTransform<double>,_10> trvec;
  TPZManVector<TPZMaterialDataT<std::complex<double>_>,_5> datavec;
  
  TPZVec<double>::Fill(errors,(double *)&datavec,0,-1);
  lVar5 = (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0xb8))(this)
  ;
  if ((lVar5 == 0) ||
     (lVar5 = __dynamic_cast(lVar5,&TPZMaterial::typeinfo,
                             &TPZNullMaterialCS<std::complex<double>>::typeinfo,0), lVar5 == 0)) {
    lVar5 = (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0xb8))
                      (this);
    if ((lVar5 == 0) ||
       (lVar5 = __dynamic_cast(lVar5,&TPZMaterial::typeinfo,
                               &TPZMatCombinedSpacesT<std::complex<double>>::typeinfo,
                               0xfffffffffffffffe), lVar5 == 0)) {
      std::operator<<((ostream *)&std::cerr,
                      "void TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra>::EvaluateErrorT(TPZVec<REAL> &, bool) [TGeometry = pzgeom::TPZGeoTetrahedra, TVar = std::complex<double>]"
                     );
      pcVar11 = " no material for this element\n";
    }
    else {
      plStack_35f50 =
           (long *)__dynamic_cast(lVar5,&TPZMatCombinedSpacesT<std::complex<double>>::typeinfo,
                                  &TPZMatErrorCombinedSpaces<std::complex<double>>::typeinfo,
                                  0xfffffffffffffffe);
      if (plStack_35f50 != (long *)0x0) {
        uVar2 = (*(code *)**(undefined8 **)((long)plStack_35f50 + *(long *)(*plStack_35f50 + -0x18))
                )((long)plStack_35f50 + *(long *)(*plStack_35f50 + -0x18));
        uVar14 = (ulong)uVar2;
        lStack_35f60 = (long)(int)uVar2;
        (*errors->_vptr_TPZVec[3])(errors);
        TPZVec<double>::Fill(errors,(double *)&datavec,0,-1);
        iVar3 = (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x90))
                          (this);
        if (iVar3 == 0) {
          return;
        }
        uStack_35f64 = (undefined4)CONCAT71(in_register_00000011,store_errors);
        iVar3 = (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0xb0))
                          (this);
        plVar6 = (long *)(**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl
                                     + 0x2d8))(this);
        obj = (TPZIntPoints *)(**(code **)(*plVar6 + 0x48))(plVar6);
        TPZAutoPointer<TPZIntPoints>::TPZAutoPointer(&intrule,obj);
        maxIntOrder = (*(intrule.fRef)->fPointer->_vptr_TPZIntPoints[7])();
        lVar5 = (long)iVar3;
        TPZManVector<int,_3>::TPZManVector(&prevorder,lVar5);
        TPZManVector<int,_3>::TPZManVector(&maxorder,lVar5,&maxIntOrder);
        (*(intrule.fRef)->fPointer->_vptr_TPZIntPoints[6])((intrule.fRef)->fPointer,&prevorder);
        if ((0xf < maxIntOrder) &&
           (maxIntOrder = *prevorder.super_TPZVec<int>.fStore, maxIntOrder < 0x10)) {
          maxIntOrder = 0xf;
        }
        (*(intrule.fRef)->fPointer->_vptr_TPZIntPoints[5])((intrule.fRef)->fPointer,&maxorder,0);
        plVar6 = (long *)(**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl
                                     + 0xb8))(this);
        iVar3 = (**(code **)(*plVar6 + 0x78))(plVar6);
        TPZManVector<double,_10>::TPZManVector(&u_exact,(long)iVar3);
        TPZFNMatrix<3,_double>::TPZFNMatrix(&du_exact,lVar5,(long)iVar3);
        pTVar7 = TPZCompEl::Reference((TPZCompEl *)this);
        iVar3 = (**(code **)(*(long *)pTVar7 + 0x210))(pTVar7);
        TPZManVector<double,_10>::TPZManVector(&intpoint,(long)iVar3);
        TPZManVector<double,_10>::TPZManVector(&values,lStack_35f60);
        TPZVec<double>::Fill(&values.super_TPZVec<double>,(double *)&datavec,0,-1);
        TPZManVector<TPZMaterialDataT<std::complex<double>_>,_5>::TPZManVector(&datavec,0);
        lVar5 = (this->fElementVec).super_TPZVec<TPZCompElSide>.fNElements;
        (*_DAT_00000018)(&datavec,lVar5);
        (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x290))
                  (this,&datavec,0);
        uVar10 = 0xffffffffffffffff;
        for (uVar13 = 0; (long)uVar13 < lVar5; uVar13 = (ulong)((int)uVar13 + 1)) {
          if (datavec.super_TPZVec<TPZMaterialDataT<std::complex<double>_>_>.fStore[uVar13].
              super_TPZMaterialData.super_TPZShapeData.fShapeType != EEmpty) {
            datavec.super_TPZVec<TPZMaterialDataT<std::complex<double>_>_>.fStore[uVar13].
            super_TPZMaterialData.fNeedsSol = true;
            uVar10 = uVar13;
          }
        }
        if ((int)uVar10 != -1) {
          TPZManVector<TPZTransform<double>,_10>::TPZManVector(&trvec,0);
          (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x280))
                    (this,&trvec);
          uVar4 = (*(intrule.fRef)->fPointer->_vptr_TPZIntPoints[3])();
          TPZFNMatrix<9,_double>::TPZFNMatrix(&jac);
          TPZFNMatrix<9,_double>::TPZFNMatrix(&axe);
          TPZFNMatrix<9,_double>::TPZFNMatrix(&jacInv);
          pTStack_35f58 = errors;
          pTVar7 = TPZCompEl::Reference((TPZCompEl *)this);
          uVar12 = 0;
          if ((int)uVar2 < 1) {
            uVar14 = 0;
          }
          if ((int)uVar4 < 1) {
            uVar4 = 0;
          }
          for (; pTVar1 = pTStack_35f58, uVar12 != uVar4; uVar12 = uVar12 + 1) {
            (*(intrule.fRef)->fPointer->_vptr_TPZIntPoints[4])
                      ((intrule.fRef)->fPointer,(ulong)uVar12,&intpoint,&weight);
            TPZGeoEl::Jacobian(pTVar7,&intpoint.super_TPZVec<double>,&jac.super_TPZFMatrix<double>,
                               &axe.super_TPZFMatrix<double>,&detJac,
                               &jacInv.super_TPZFMatrix<double>);
            (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x2b0))
                      (this,&intpoint,&trvec,&datavec);
            weight = ABS(detJac) * weight;
            (**(code **)*plStack_35f50)(plStack_35f50,&datavec,&values);
            pdVar9 = pTStack_35f58->fStore;
            for (uVar10 = 0; uVar14 != uVar10; uVar10 = uVar10 + 1) {
              pdVar9[uVar10] = values.super_TPZVec<double>.fStore[uVar10] * weight + pdVar9[uVar10];
            }
          }
          for (uVar10 = 0; uVar14 != uVar10; uVar10 = uVar10 + 1) {
            dVar15 = pTVar1->fStore[uVar10];
            if (dVar15 < 0.0) {
              dVar15 = sqrt(dVar15);
            }
            else {
              dVar15 = SQRT(dVar15);
            }
            pTVar1->fStore[uVar10] = dVar15;
          }
          if ((char)uStack_35f64 != '\0') {
            row = (this->super_TPZMultiphysicsElement).super_TPZCompEl.fIndex;
            pTVar8 = TPZCompEl::Mesh((TPZCompEl *)this);
            this_00 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(&pTVar8->fElementSolution);
            if ((this_00->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < lStack_35f60) {
              std::operator<<((ostream *)&std::cout,
                              "The element solution of the mesh should be resized before EvaluateError\n"
                             );
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzmultiphysicscompel.cpp"
                         ,0x4f0);
            }
            for (uVar10 = 0; uVar14 != uVar10; uVar10 = uVar10 + 1) {
              dVar15 = pTVar1->fStore[uVar10];
              pdVar9 = TPZFMatrix<double>::operator()(this_00,row,uVar10);
              *pdVar9 = dVar15;
            }
          }
          (*(intrule.fRef)->fPointer->_vptr_TPZIntPoints[5])((intrule.fRef)->fPointer,&prevorder,0);
          TPZFNMatrix<9,_double>::~TPZFNMatrix(&jacInv);
          TPZFNMatrix<9,_double>::~TPZFNMatrix(&axe);
          TPZFNMatrix<9,_double>::~TPZFNMatrix(&jac);
          TPZManVector<TPZTransform<double>,_10>::~TPZManVector(&trvec);
          TPZManVector<TPZMaterialDataT<std::complex<double>_>,_5>::~TPZManVector(&datavec);
          TPZManVector<double,_10>::~TPZManVector(&values);
          TPZManVector<double,_10>::~TPZManVector(&intpoint);
          TPZFNMatrix<3,_double>::~TPZFNMatrix(&du_exact);
          TPZManVector<double,_10>::~TPZManVector(&u_exact);
          TPZManVector<int,_3>::~TPZManVector(&maxorder);
          TPZManVector<int,_3>::~TPZManVector(&prevorder);
          TPZAutoPointer<TPZIntPoints>::~TPZAutoPointer(&intrule);
          return;
        }
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzmultiphysicscompel.cpp"
                   ,0x4cd);
      }
      std::operator<<((ostream *)&std::cerr,
                      "void TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra>::EvaluateErrorT(TPZVec<REAL> &, bool) [TGeometry = pzgeom::TPZGeoTetrahedra, TVar = std::complex<double>]"
                     );
      std::operator<<((ostream *)&std::cerr," no error interface for this element.\n");
      pcVar11 = "See TPZMatErrorCombinedSpaces\n";
    }
    std::operator<<((ostream *)&std::cerr,pcVar11);
  }
  return;
}

Assistant:

void TPZMultiphysicsCompEl<TGeometry>::EvaluateErrorT(TPZVec<REAL> &errors, bool store_errors) {
  errors.Fill(0.);
  auto *nullmat = dynamic_cast<TPZNullMaterialCS<TVar> *>(this->Material());
    if(nullmat) return;
  auto *mat =
      dynamic_cast<TPZMatCombinedSpacesT<TVar>*>(this->Material());
  auto *matError =
      dynamic_cast<TPZMatErrorCombinedSpaces<TVar>*>(mat);
  
  //TPZMaterial * matptr = material.operator->();
  if (!mat) {
      PZError << __PRETTY_FUNCTION__;
      PZError<<" no material for this element\n";
      return;
  }
  if(!matError){
      PZError << __PRETTY_FUNCTION__;
      PZError<<" no error interface for this element.\n";
      PZError<<"See TPZMatErrorCombinedSpaces\n";
      return;
  }
      
  const int NErrors = matError->NEvalErrors();
  errors.Resize(NErrors);
  errors.Fill(0.);

  // Return if BC
  if (this->NConnects() == 0) return;

  // Adjust the order of the integration rule
  int dim = Dimension();
  TPZAutoPointer<TPZIntPoints> intrule = this->GetIntegrationRule().Clone();
  int maxIntOrder = intrule->GetMaxOrder();
  TPZManVector<int, 3> prevorder(dim), maxorder(dim, maxIntOrder);
  intrule->GetOrder(prevorder);
  const int order_limit = 15;
  if (maxIntOrder > order_limit) {
    if (prevorder[0] > order_limit) {
      maxIntOrder = prevorder[0];
    } else {
      maxIntOrder = order_limit;
    }
  }

  intrule->SetOrder(maxorder);

  const int ndof = this->Material()->NStateVariables();
  TPZManVector<STATE, 10> u_exact(ndof);
  TPZFNMatrix<3, STATE> du_exact(dim, ndof);
  TPZManVector<REAL, 10> intpoint(Reference()->Dimension()), values(NErrors);
  values.Fill(0.0);
  REAL weight;

  TPZManVector<TPZMaterialDataT<TVar>, 5> datavec;
  const int64_t nref = fElementVec.size();
  datavec.resize(nref);
  InitMaterialData(datavec);
  int iactive = -1;
  for (unsigned int i = 0; i < nref; ++i) {
    if (datavec[i].fShapeType != TPZMaterialData::EEmpty) {
      datavec[i].fNeedsSol = true;
      iactive = i;
    }
  }

  if (iactive == -1) DebugStop();

  TPZManVector<TPZTransform<> > trvec;
  AffineTransform(trvec);

  int nintpoints = intrule->NPoints();
  TPZFNMatrix<9, REAL> jac, axe, jacInv;
  REAL detJac;
  TPZGeoEl *ref = this->Reference();

  for (int nint = 0; nint < nintpoints; nint++) {

    intrule->Point(nint, intpoint, weight);

    ref->Jacobian(intpoint, jac, axe, detJac, jacInv);
    this->ComputeRequiredData(intpoint, trvec, datavec);

    weight *= fabs(detJac);
    matError->Errors(datavec, values);

    for (int ier = 0; ier < NErrors; ier++) {
      errors[ier] += values[ier] * weight;
    }

  }//fim for : integration rule
  //Norma sobre o elemento
  for (int ier = 0; ier < NErrors; ier++) {
    errors[ier] = sqrt(errors[ier]);
  }//for ier

  if (store_errors) {
    int64_t index = Index();
    TPZFMatrix<STATE> &elvals = Mesh()->ElementSolution();
    if (elvals.Cols() < NErrors) {
      std::cout << "The element solution of the mesh should be resized before EvaluateError\n";
      DebugStop();
    }
    for (int ier = 0; ier < NErrors; ier++) {
      elvals(index, ier) = errors[ier];
    }
  }
  intrule->SetOrder(prevorder);
}